

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multifile_test_chai.cpp
# Opt level: O2

void __thiscall Multi_Test_Chai::Multi_Test_Chai(Multi_Test_Chai *this)

{
  ChaiScript_Basic *this_00;
  pointer *__ptr;
  __uniq_ptr_impl<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  local_88;
  _Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false> local_80;
  ModulePtr local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  _Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_> local_30;
  
  this_00 = (ChaiScript_Basic *)operator_new(800);
  chaiscript::Std_Lib::library();
  std::
  make_unique<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>>
            ();
  local_88._M_t.
  super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>._M_head_impl =
       (tuple<chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
        )(tuple<chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
          )local_80._M_head_impl;
  local_80._M_head_impl = (ChaiScript_Parser_Base *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chaiscript::default_options();
  chaiscript::ChaiScript_Basic::ChaiScript_Basic
            (this_00,&local_78,
             (unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
              *)&local_88,&local_48,&local_68,
             (vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&local_30);
  std::__shared_ptr<chaiscript::ChaiScript_Basic,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::ChaiScript_Basic,void>
            ((__shared_ptr<chaiscript::ChaiScript_Basic,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::_Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>::~_Vector_base
            (&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_88._M_t.
      super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
      .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
       )0x0) {
    (*(*(_func_int ***)
        local_88._M_t.
        super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
        .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>._M_head_impl)[4]
    )();
  }
  local_88._M_t.
  super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>._M_head_impl =
       (tuple<chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
        )(_Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
          )0x0;
  std::
  unique_ptr<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>,_std::default_delete<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>_>_>
  ::~unique_ptr((unique_ptr<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>,_std::default_delete<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>_>_>
                 *)&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

Multi_Test_Chai::Multi_Test_Chai()
    : m_chai(new chaiscript::ChaiScript_Basic(
        chaiscript::Std_Lib::library(),
        std::make_unique<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Noop_Tracer, chaiscript::optimizer::Optimizer_Default>>())) {
}